

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O2

int read_feed(feed_t *instance,char *feed_directory_path)

{
  int iVar1;
  FILE *pFVar2;
  char *trips_fname;
  char *transfers_fname;
  char *stops_fname;
  char *stop_times_fname;
  char *shapes_fname;
  char *routes_fname;
  char *pathways_fname;
  char *levels_fname;
  char *frequencies_fname;
  char *feed_info_fname;
  char *fare_rules_fname;
  char *fare_attributes_fname;
  char *calendar_records_fname;
  char *calendar_dates_fname;
  char *agencies_fname;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  make_filepath(&local_20,feed_directory_path,"agency.txt");
  make_filepath(&local_28,feed_directory_path,"calendar_dates.txt");
  make_filepath(&local_30,feed_directory_path,"calendar.txt");
  make_filepath(&local_38,feed_directory_path,"fare_attributes.txt");
  make_filepath(&local_40,feed_directory_path,"fare_rules.txt");
  make_filepath(&local_48,feed_directory_path,"feed_info.txt");
  make_filepath(&local_50,feed_directory_path,"frequencies.txt");
  make_filepath(&local_58,feed_directory_path,"levels.txt");
  make_filepath(&local_60,feed_directory_path,"pathways.txt");
  make_filepath(&local_68,feed_directory_path,"routes.txt");
  make_filepath(&local_70,feed_directory_path,"shapes.txt");
  make_filepath(&local_78,feed_directory_path,"stop_times.txt");
  make_filepath(&local_80,feed_directory_path,"stops.txt");
  make_filepath(&local_88,feed_directory_path,"transfers.txt");
  make_filepath(&local_90,feed_directory_path,"trips.txt");
  init_feed(instance);
  pFVar2 = fopen(local_20,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->agency_count = -1;
  }
  else {
    iVar1 = read_all_agencies((FILE *)pFVar2,&instance->agencies);
    instance->agency_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_28,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->calendar_dates_count = -1;
  }
  else {
    iVar1 = read_all_calendar_dates((FILE *)pFVar2,&instance->calendar_dates);
    instance->calendar_dates_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_30,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->calendar_records_count = -1;
  }
  else {
    iVar1 = read_all_calendar_records((FILE *)pFVar2,&instance->calendar_records);
    instance->calendar_records_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_38,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->fare_attributes_count = -1;
  }
  else {
    iVar1 = read_all_fare_attributes((FILE *)pFVar2,&instance->fare_attributes);
    instance->fare_attributes_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_40,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->fare_rules_count = -1;
  }
  else {
    iVar1 = read_all_fare_rules((FILE *)pFVar2,&instance->fare_rules);
    instance->fare_rules_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_48,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->feed_info_count = -1;
  }
  else {
    iVar1 = read_all_feed_info((FILE *)pFVar2,&instance->feed_info);
    instance->feed_info_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_50,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->frequencies_count = -1;
  }
  else {
    iVar1 = read_all_frequencies((FILE *)pFVar2,&instance->frequencies);
    instance->frequencies_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_58,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->levels_count = -1;
  }
  else {
    iVar1 = read_all_levels((FILE *)pFVar2,&instance->levels);
    instance->levels_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_60,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->pathways_count = -1;
  }
  else {
    iVar1 = read_all_pathways((FILE *)pFVar2,&instance->pathways);
    instance->pathways_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_68,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->routes_count = -1;
  }
  else {
    iVar1 = read_all_routes((FILE *)pFVar2,&instance->routes);
    instance->routes_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_70,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->shapes_count = -1;
  }
  else {
    iVar1 = read_all_shapes((FILE *)pFVar2,&instance->shapes);
    instance->shapes_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_78,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->stop_times_count = -1;
  }
  else {
    iVar1 = read_all_stop_times((FILE *)pFVar2,&instance->stop_times);
    instance->stop_times_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_80,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->stops_count = -1;
  }
  else {
    iVar1 = read_all_stops((FILE *)pFVar2,&instance->stops);
    instance->stops_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_88,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->transfers_count = -1;
  }
  else {
    iVar1 = read_all_transfers((FILE *)pFVar2,&instance->transfers);
    instance->transfers_count = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(local_90,"r");
  if (pFVar2 == (FILE *)0x0) {
    instance->trips_count = -1;
  }
  else {
    iVar1 = read_all_trips((FILE *)pFVar2,&instance->trips);
    instance->trips_count = iVar1;
    fclose(pFVar2);
  }
  free(local_20);
  free(local_28);
  free(local_30);
  free(local_38);
  free(local_40);
  free(local_48);
  free(local_50);
  free(local_58);
  free(local_60);
  free(local_68);
  free(local_70);
  free(local_78);
  free(local_80);
  free(local_88);
  free(local_90);
  return 0;
}

Assistant:

int read_feed(feed_t *instance, const char *feed_directory_path) {
    char *agencies_fname;
    char *calendar_dates_fname;
    char *calendar_records_fname;
    char *fare_attributes_fname;
    char *fare_rules_fname;
    char *feed_info_fname;
    char *frequencies_fname;
    char *levels_fname;
    char *pathways_fname;
    char *routes_fname;
    char *shapes_fname;
    char *stop_times_fname;
    char *stops_fname;
    char *transfers_fname;
    char *trips_fname;

    make_filepath(&agencies_fname, feed_directory_path, "agency.txt");
    make_filepath(&calendar_dates_fname, feed_directory_path, "calendar_dates.txt");
    make_filepath(&calendar_records_fname, feed_directory_path, "calendar.txt");
    make_filepath(&fare_attributes_fname, feed_directory_path, "fare_attributes.txt");
    make_filepath(&fare_rules_fname, feed_directory_path, "fare_rules.txt");
    make_filepath(&feed_info_fname, feed_directory_path, "feed_info.txt");
    make_filepath(&frequencies_fname, feed_directory_path, "frequencies.txt");
    make_filepath(&levels_fname, feed_directory_path, "levels.txt");
    make_filepath(&pathways_fname, feed_directory_path, "pathways.txt");
    make_filepath(&routes_fname, feed_directory_path, "routes.txt");
    make_filepath(&shapes_fname, feed_directory_path, "shapes.txt");
    make_filepath(&stop_times_fname, feed_directory_path, "stop_times.txt");
    make_filepath(&stops_fname, feed_directory_path, "stops.txt");
    make_filepath(&transfers_fname, feed_directory_path, "transfers.txt");
    make_filepath(&trips_fname, feed_directory_path, "trips.txt");

    init_feed(instance);

    FILE *fp_agencies = fopen(agencies_fname, "r");
    if (fp_agencies) {
        instance->agency_count = read_all_agencies(fp_agencies, &(instance->agencies));
        fclose(fp_agencies);
    } else {
        instance->agency_count = -1;
    }

    FILE *fp_calendar_dates = fopen(calendar_dates_fname, "r");
    if (fp_calendar_dates) {
        instance->calendar_dates_count = read_all_calendar_dates(fp_calendar_dates, &(instance->calendar_dates));
        fclose(fp_calendar_dates);
    } else {
        instance->calendar_dates_count = -1;
    }

    FILE *fp_calendar_records = fopen(calendar_records_fname, "r");
    if (fp_calendar_records) {
        instance->calendar_records_count = read_all_calendar_records(fp_calendar_records, &(instance->calendar_records));
        fclose(fp_calendar_records);
    } else {
        instance->calendar_records_count = -1;
    }

    FILE *fp_fare_attributes = fopen(fare_attributes_fname, "r");
    if (fp_fare_attributes) {
        instance->fare_attributes_count = read_all_fare_attributes(fp_fare_attributes, &(instance->fare_attributes));
        fclose(fp_fare_attributes);
    } else {
        instance->fare_attributes_count = -1;
    }

    FILE *fp_fare_rules = fopen(fare_rules_fname, "r");
    if (fp_fare_rules) {
        instance->fare_rules_count = read_all_fare_rules(fp_fare_rules, &(instance->fare_rules));
        fclose(fp_fare_rules);
    } else {
        instance->fare_rules_count = -1;
    }

    FILE *fp_feed_info = fopen(feed_info_fname, "r");
    if (fp_feed_info) {
        instance->feed_info_count = read_all_feed_info(fp_feed_info, &(instance->feed_info));
        fclose(fp_feed_info);
    } else {
        instance->feed_info_count = -1;
    }

    FILE *fp_frequencies = fopen(frequencies_fname, "r");
    if (fp_frequencies) {
        instance->frequencies_count = read_all_frequencies(fp_frequencies, &(instance->frequencies));
        fclose(fp_frequencies);
    } else {
        instance->frequencies_count = -1;
    }

    FILE *fp_levels = fopen(levels_fname, "r");
    if (fp_levels) {
        instance->levels_count = read_all_levels(fp_levels, &(instance->levels));
        fclose(fp_levels);
    } else {
        instance->levels_count = -1;
    }

    FILE *fp_pathways = fopen(pathways_fname, "r");
    if (fp_pathways) {
        instance->pathways_count = read_all_pathways(fp_pathways, &(instance->pathways));
        fclose(fp_pathways);
    } else {
        instance->pathways_count = -1;
    }

    FILE *fp_routes = fopen(routes_fname, "r");
    if (fp_routes) {
        instance->routes_count = read_all_routes(fp_routes, &(instance->routes));
        fclose(fp_routes);
    } else {
        instance->routes_count = -1;
    }

    FILE *fp_shapes = fopen(shapes_fname, "r");
    if (fp_shapes) {
        instance->shapes_count = read_all_shapes(fp_shapes, &(instance->shapes));
        fclose(fp_shapes);
    } else {
        instance->shapes_count = -1;
    }

    FILE *fp_stop_times = fopen(stop_times_fname, "r");
    if (fp_stop_times) {
        instance->stop_times_count = read_all_stop_times(fp_stop_times, &(instance->stop_times));
        fclose(fp_stop_times);
    } else {
        instance->stop_times_count = -1;
    }

    FILE *fp_stops = fopen(stops_fname, "r");
    if (fp_stops) {
        instance->stops_count = read_all_stops(fp_stops, &(instance->stops));
        fclose(fp_stops);
    } else {
        instance->stops_count = -1;
    }

    FILE *fp_transfers = fopen(transfers_fname, "r");
    if (fp_transfers) {
        instance->transfers_count = read_all_transfers(fp_transfers, &(instance->transfers));
        fclose(fp_transfers);
    } else {
        instance->transfers_count = -1;
    }

    FILE *fp_trips = fopen(trips_fname, "r");
    if (fp_trips) {
        instance->trips_count = read_all_trips(fp_trips, &(instance->trips));
        fclose(fp_trips);
    } else {
        instance->trips_count = -1;
    }


    free(agencies_fname);
    free(calendar_dates_fname);
    free(calendar_records_fname);
    free(fare_attributes_fname);
    free(fare_rules_fname);
    free(feed_info_fname);
    free(frequencies_fname);
    free(levels_fname);
    free(pathways_fname);
    free(routes_fname);
    free(shapes_fname);
    free(stop_times_fname);
    free(stops_fname);
    free(transfers_fname);
    free(trips_fname);

    return 0;
}